

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O3

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,XrBodyJointLocationsFB *value,
               string *prefix,string *type_string,bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  XrStructureType XVar3;
  pointer pcVar4;
  PFN_xrStructureTypeToString p_Var5;
  void *value_00;
  XrStructureType __val;
  uint uVar6;
  bool bVar7;
  char *pcVar8;
  XrInstance pXVar9;
  invalid_argument *this;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  XrBodyJointLocationsFB *pXVar15;
  ulong __val_00;
  string time_prefix;
  string next_prefix;
  string type_prefix;
  string skeletonchangedcount_prefix;
  string jointlocations_prefix;
  string jointcount_prefix;
  string confidence_prefix;
  string isactive_prefix;
  string __str_1;
  ostringstream oss_isActive;
  ostringstream oss_skeletonChangedCount;
  ostringstream oss_jointCount;
  ostringstream oss_confidence;
  ostringstream oss_jointLocations;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_8d8;
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  *local_8b8;
  XrBodyJointLocationsFB *local_8b0;
  long *local_8a8;
  long local_8a0;
  long local_898 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_888;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_868;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_848;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_828;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_808;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c8;
  string local_7a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  ios_base local_718 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_610 [3];
  ios_base local_5a0 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498 [3];
  ios_base local_428 [264];
  undefined1 local_320 [112];
  ios_base local_2b0 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [3];
  ios_base local_138 [264];
  
  paVar1 = &local_788.field_2;
  local_8b0 = value;
  local_788._M_dataplus._M_p = (pointer)paVar1;
  local_320._0_8_ = value;
  std::__cxx11::string::_M_construct((ulong)&local_788,'\x12');
  *local_788._M_dataplus._M_p = '0';
  local_788._M_dataplus._M_p[1] = 'x';
  pcVar8 = local_788._M_dataplus._M_p + (local_788._M_string_length - 1);
  lVar11 = 0;
  do {
    bVar2 = local_320[lVar11];
    *pcVar8 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 & 0xf];
    pcVar8[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 >> 4];
    lVar11 = lVar11 + 1;
    pcVar8 = pcVar8 + -2;
  } while (lVar11 != 8);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,&local_788);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_788._M_dataplus._M_p != paVar1) {
    operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)prefix);
  local_888._M_dataplus._M_p = (pointer)&local_888.field_2;
  pcVar4 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_888,pcVar4,pcVar4 + prefix->_M_string_length);
  pXVar15 = local_8b0;
  std::__cxx11::string::append((char *)&local_888);
  local_8b8 = (vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
               *)contents;
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    XVar3 = pXVar15->type;
    __val = -XVar3;
    if (0 < (int)XVar3) {
      __val = XVar3;
    }
    uVar14 = 1;
    if (XR_TYPE_SWAPCHAIN_CREATE_INFO < __val) {
      uVar13 = (ulong)__val;
      uVar6 = 4;
      do {
        uVar14 = uVar6;
        uVar10 = (uint)uVar13;
        if (uVar10 < 100) {
          uVar14 = uVar14 - 2;
          goto LAB_0017fa41;
        }
        if (uVar10 < 1000) {
          uVar14 = uVar14 - 1;
          goto LAB_0017fa41;
        }
        if (uVar10 < 10000) goto LAB_0017fa41;
        uVar13 = uVar13 / 10000;
        uVar6 = uVar14 + 4;
      } while (99999 < uVar10);
      uVar14 = uVar14 + 1;
    }
LAB_0017fa41:
    local_788._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_788,(char)uVar14 - (char)((int)XVar3 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_788._M_dataplus._M_p + (XVar3 >> 0x1f),uVar14,__val);
    contents = (vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_8b8;
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              (local_8b8,(char (*) [16])"XrStructureType",&local_888,&local_788);
    pXVar15 = local_8b0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_788._M_dataplus._M_p != &local_788.field_2) {
      operator_delete(local_788._M_dataplus._M_p,local_788.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_758 = 0;
    uStack_750 = 0;
    local_768 = 0;
    uStack_760 = 0;
    local_788.field_2._M_allocated_capacity = 0;
    local_788.field_2._8_8_ = 0;
    local_788._M_dataplus._M_p = (pointer)0x0;
    local_788._M_string_length = 0;
    p_Var5 = gen_dispatch_table->StructureTypeToString;
    pXVar9 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var5)(pXVar9,pXVar15->type,(char *)&local_788);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_888,(char (*) [64])&local_788);
  }
  local_8a8 = local_898;
  pcVar4 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_8a8,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_8a8);
  value_00 = pXVar15->next;
  local_7a8._M_dataplus._M_p = (pointer)&local_7a8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_7a8,local_8a8,local_8a0 + (long)local_8a8);
  bVar7 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_7a8,contents);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7a8._M_dataplus._M_p != &local_7a8.field_2) {
    operator_delete(local_7a8._M_dataplus._M_p,local_7a8.field_2._M_allocated_capacity + 1);
  }
  if (!bVar7) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Invalid Operation");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_7e8._M_dataplus._M_p = (pointer)&local_7e8.field_2;
  pcVar4 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_7e8,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_7e8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_788);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_788,"0x",2);
  *(uint *)((long)&local_788.field_2 + *(long *)(local_788._M_dataplus._M_p + -0x18) + 8) =
       *(uint *)((long)&local_788.field_2 + *(long *)(local_788._M_dataplus._M_p + -0x18) + 8) &
       0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)&local_788);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [9])"XrBool32",&local_7e8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_320);
  if ((XrBodyJointLocationsFB *)local_320._0_8_ != (XrBodyJointLocationsFB *)(local_320 + 0x10)) {
    operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
  }
  local_808._M_dataplus._M_p = (pointer)&local_808.field_2;
  pcVar4 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_808,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_808);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  *(undefined8 *)
   (local_320 + (long)&((*(XrBodyJointLocationFB **)(local_320._0_8_ + -0x18))->pose).orientation) =
       0x20;
  std::ostream::_M_insert<double>((double)pXVar15->confidence);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[6],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [6])"float",&local_808,local_498);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498[0]._M_dataplus._M_p != &local_498[0].field_2) {
    operator_delete(local_498[0]._M_dataplus._M_p,local_498[0].field_2._M_allocated_capacity + 1);
  }
  local_828._M_dataplus._M_p = (pointer)&local_828.field_2;
  pcVar4 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_828,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_828);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_498);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_498,"0x",2);
  *(uint *)((long)&local_498[0].field_2 + *(long *)(local_498[0]._M_dataplus._M_p + -0x18) + 8) =
       *(uint *)((long)&local_498[0].field_2 + *(long *)(local_498[0]._M_dataplus._M_p + -0x18) + 8)
       & 0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)local_498);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [9])"uint32_t",&local_828,local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  local_848._M_dataplus._M_p = (pointer)&local_848.field_2;
  pcVar4 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_848,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_848);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  *(uint *)((long)&local_1a8[0].field_2 + *(long *)(local_1a8[0]._M_dataplus._M_p + -0x18) + 8) =
       *(uint *)((long)&local_1a8[0].field_2 + *(long *)(local_1a8[0]._M_dataplus._M_p + -0x18) + 8)
       & 0xffffffb5 | 8;
  std::ostream::_M_insert<void_const*>(local_1a8);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[23],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [23])"XrBodyJointLocationFB*",&local_848,local_610);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610[0]._M_dataplus._M_p != &local_610[0].field_2) {
    operator_delete(local_610[0]._M_dataplus._M_p,local_610[0].field_2._M_allocated_capacity + 1);
  }
  local_868._M_dataplus._M_p = (pointer)&local_868.field_2;
  pcVar4 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_868,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_868);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_610);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_610,"0x",2);
  *(uint *)((long)&local_610[0].field_2 + *(long *)(local_610[0]._M_dataplus._M_p + -0x18) + 8) =
       *(uint *)((long)&local_610[0].field_2 + *(long *)(local_610[0]._M_dataplus._M_p + -0x18) + 8)
       & 0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)local_610);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [9])"uint32_t",&local_868,&local_8d8);
  paVar1 = &local_8d8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d8._M_dataplus._M_p,local_8d8.field_2._M_allocated_capacity + 1);
  }
  pcVar4 = (prefix->_M_dataplus)._M_p;
  local_8d8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_8d8,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_8d8);
  uVar13 = pXVar15->time;
  __val_00 = -uVar13;
  if (0 < (long)uVar13) {
    __val_00 = uVar13;
  }
  uVar14 = 1;
  if (9 < __val_00) {
    uVar12 = __val_00;
    uVar6 = 4;
    do {
      uVar14 = uVar6;
      if (uVar12 < 100) {
        uVar14 = uVar14 - 2;
        goto LAB_0017ffdd;
      }
      if (uVar12 < 1000) {
        uVar14 = uVar14 - 1;
        goto LAB_0017ffdd;
      }
      if (uVar12 < 10000) goto LAB_0017ffdd;
      bVar7 = 99999 < uVar12;
      uVar12 = uVar12 / 10000;
      uVar6 = uVar14 + 4;
    } while (bVar7);
    uVar14 = uVar14 + 1;
  }
LAB_0017ffdd:
  local_7c8._M_dataplus._M_p = (pointer)&local_7c8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_7c8,(char)uVar14 - (char)((long)uVar13 >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_7c8._M_dataplus._M_p + -((long)uVar13 >> 0x3f),uVar14,__val_00);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[7],std::__cxx11::string&,std::__cxx11::string>
            (local_8b8,(char (*) [7])"XrTime",&local_8d8,&local_7c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7c8._M_dataplus._M_p != &local_7c8.field_2) {
    operator_delete(local_7c8._M_dataplus._M_p,local_7c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_8d8._M_dataplus._M_p,local_8d8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_610);
  std::ios_base::~ios_base(local_5a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_868._M_dataplus._M_p != &local_868.field_2) {
    operator_delete(local_868._M_dataplus._M_p,local_868.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_848._M_dataplus._M_p != &local_848.field_2) {
    operator_delete(local_848._M_dataplus._M_p,local_848.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_498);
  std::ios_base::~ios_base(local_428);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_828._M_dataplus._M_p != &local_828.field_2) {
    operator_delete(local_828._M_dataplus._M_p,local_828.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base(local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_808._M_dataplus._M_p != &local_808.field_2) {
    operator_delete(local_808._M_dataplus._M_p,local_808.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_788);
  std::ios_base::~ios_base(local_718);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7e8._M_dataplus._M_p != &local_7e8.field_2) {
    operator_delete(local_7e8._M_dataplus._M_p,local_7e8.field_2._M_allocated_capacity + 1);
  }
  if (local_8a8 != local_898) {
    operator_delete(local_8a8,local_898[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_888._M_dataplus._M_p != &local_888.field_2) {
    operator_delete(local_888._M_dataplus._M_p,local_888.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrBodyJointLocationsFB* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string isactive_prefix = prefix;
        isactive_prefix += "isActive";
        std::ostringstream oss_isActive;
        oss_isActive << "0x" << std::hex << (value->isActive);
        contents.emplace_back("XrBool32", isactive_prefix, oss_isActive.str());
        std::string confidence_prefix = prefix;
        confidence_prefix += "confidence";
        std::ostringstream oss_confidence;
        oss_confidence << std::setprecision(32) << (value->confidence);
        contents.emplace_back("float", confidence_prefix, oss_confidence.str());
        std::string jointcount_prefix = prefix;
        jointcount_prefix += "jointCount";
        std::ostringstream oss_jointCount;
        oss_jointCount << "0x" << std::hex << (value->jointCount);
        contents.emplace_back("uint32_t", jointcount_prefix, oss_jointCount.str());
        std::string jointlocations_prefix = prefix;
        jointlocations_prefix += "jointLocations";
        std::ostringstream oss_jointLocations;
        oss_jointLocations << std::hex << reinterpret_cast<const void*>(value->jointLocations);
        contents.emplace_back("XrBodyJointLocationFB*", jointlocations_prefix, oss_jointLocations.str());
        std::string skeletonchangedcount_prefix = prefix;
        skeletonchangedcount_prefix += "skeletonChangedCount";
        std::ostringstream oss_skeletonChangedCount;
        oss_skeletonChangedCount << "0x" << std::hex << (value->skeletonChangedCount);
        contents.emplace_back("uint32_t", skeletonchangedcount_prefix, oss_skeletonChangedCount.str());
        std::string time_prefix = prefix;
        time_prefix += "time";
        contents.emplace_back("XrTime", time_prefix, std::to_string(value->time));
        return true;
    } catch(...) {
    }
    return false;
}